

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

void __thiscall BasicBlock::UnlinkInstr(BasicBlock *this,Instr *instr)

{
  BasicBlock *pBVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Instr *pIVar5;
  long lVar6;
  Func **ppFVar7;
  
  bVar3 = Contains(this,instr);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0xd76,"(this->Contains(instr))","this->Contains(instr)");
    if (!bVar3) goto LAB_003fdb56;
    *puVar4 = 0;
  }
  pBVar1 = this->next;
  ppFVar7 = (Func **)&pBVar1->firstInstr;
  if (pBVar1 == (BasicBlock *)0x0) {
    ppFVar7 = &this->func;
  }
  lVar6 = 0x18;
  if (pBVar1 == (BasicBlock *)0x0) {
    lVar6 = 0xd0;
  }
  pIVar5 = this->firstInstr;
  if (pIVar5 == *(Instr **)((long)&(*ppFVar7)->m_alloc + lVar6)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0xd77,"(this->GetFirstInstr() != this->GetLastInstr())",
                       "this->GetFirstInstr() != this->GetLastInstr()");
    if (!bVar3) goto LAB_003fdb56;
    *puVar4 = 0;
    pIVar5 = this->firstInstr;
  }
  if (pIVar5 == instr) {
    if ((pIVar5->m_kind == InstrKindProfiledLabel) || (pIVar5->m_kind == InstrKindLabel)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0xd7a,"(!this->GetFirstInstr()->IsLabelInstr())",
                         "!this->GetFirstInstr()->IsLabelInstr()");
      if (!bVar3) {
LAB_003fdb56:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    this->firstInstr = instr->m_next;
  }
  IR::Instr::Unlink(instr);
  return;
}

Assistant:

void
BasicBlock::UnlinkInstr(IR::Instr * instr)
{
    Assert(this->Contains(instr));
    Assert(this->GetFirstInstr() != this->GetLastInstr());
    if (instr == this->GetFirstInstr())
    {
        Assert(!this->GetFirstInstr()->IsLabelInstr());
        this->SetFirstInstr(instr->m_next);
    }
    else if (instr == this->GetLastInstr())
    {
        this->SetLastInstr(instr->m_prev);
    }

    instr->Unlink();
}